

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ManLevelRNum(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  Gia_ManCleanLevels(p,iVar1);
  p->nLevels = 0;
  local_1c = p->nObjs;
  while( true ) {
    local_1c = local_1c + -1;
    bVar3 = false;
    if (-1 < local_1c) {
      pGStack_18 = Gia_ManObj(p,local_1c);
      bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    if ((p->fGiaSimple == 0) && (iVar1 = Gia_ObjIsBuf(pGStack_18), iVar1 != 0)) {
      iVar1 = Gia_ObjFaninId0(pGStack_18,local_1c);
      iVar2 = Gia_ObjLevel(p,pGStack_18);
      Gia_ObjUpdateLevelId(p,iVar1,iVar2);
    }
    else {
      iVar1 = Gia_ObjIsAnd(pGStack_18);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_18);
        if (iVar1 == 0) {
          iVar1 = p->nLevels;
          iVar2 = Gia_ObjLevel(p,pGStack_18);
          iVar1 = Abc_MaxInt(iVar1,iVar2);
          p->nLevels = iVar1;
        }
        else {
          iVar1 = Gia_ObjFaninId0(pGStack_18,local_1c);
          Gia_ObjUpdateLevelId(p,iVar1,1);
        }
      }
      else {
        iVar1 = Gia_ObjFaninId0(pGStack_18,local_1c);
        iVar2 = Gia_ObjLevel(p,pGStack_18);
        Gia_ObjUpdateLevelId(p,iVar1,iVar2 + 1);
        iVar1 = Gia_ObjFaninId1(pGStack_18,local_1c);
        iVar2 = Gia_ObjLevel(p,pGStack_18);
        Gia_ObjUpdateLevelId(p,iVar1,iVar2 + 1);
      }
    }
  }
  return p->nLevels;
}

Assistant:

int Gia_ManLevelRNum( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachObjReverse( p, pObj, i )
    {
        if ( !p->fGiaSimple && Gia_ObjIsBuf(pObj) )
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), Gia_ObjLevel(p, pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), 1+Gia_ObjLevel(p, pObj) );
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId1(pObj, i), 1+Gia_ObjLevel(p, pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjUpdateLevelId( p, Gia_ObjFaninId0(pObj, i), 1 );
        else
            p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}